

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O0

AssertionResult * __thiscall
iutest::internal::
CmpHelperEQ<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>>
          (AssertionResult *__return_storage_ptr__,internal *this,char *expected_str,
          char *actual_str,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *expected,
          basic_string_view<char,_std::char_traits<char>_> *actual)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *actual_expression;
  char *expected_expression;
  bool bVar1;
  string local_70;
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  basic_string_view<char,_std::char_traits<char>_> *actual_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *expected_local;
  char *actual_str_local;
  char *expected_str_local;
  
  local_30 = expected;
  actual_local = (basic_string_view<char,_std::char_traits<char>_> *)actual_str;
  expected_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)expected_str
  ;
  actual_str_local = (char *)this;
  expected_str_local = (char *)__return_storage_ptr__;
  bVar1 = iuOperatorEQ<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
                    ((basic_string_view<char,_std::char_traits<char>_> *)expected,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)actual_str
                    );
  expected_expression = actual_str_local;
  actual_expression = expected_local;
  if (bVar1) {
    AssertionSuccess();
  }
  else {
    FormatForComparisonFailureMessage<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>>
              (&local_50,(internal *)actual_local,local_30,
               (basic_string_view<char,_std::char_traits<char>_> *)actual_str);
    FormatForComparisonFailureMessage<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
              (&local_70,(internal *)local_30,actual_local,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)actual_str);
    EqFailure(__return_storage_ptr__,expected_expression,(char *)actual_expression,&local_50,
              &local_70,false);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

IUTEST_COND_LIKELY( iuOperatorEQ(actual, expected) )
    {
        return AssertionSuccess();
    }